

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::clearEmptySegments(string *unit)

{
  const_iterator pvVar1;
  char *pcVar2;
  ulong local_40;
  size_type fnd;
  value_type *seg;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *__range1;
  bool changed;
  string *unit_local;
  
  __range1._7_1_ = false;
  __end1 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
           ::begin((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                    *)Esegs_abi_cxx11_);
  pvVar1 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
           ::end((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                  *)Esegs_abi_cxx11_);
LAB_0019abfb:
  if (__end1 == pvVar1) {
    return __range1._7_1_;
  }
  local_40 = std::__cxx11::string::find((string *)unit,(ulong)__end1);
LAB_0019ac26:
  do {
    if (local_40 == 0xffffffffffffffff) break;
    if (local_40 != 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)unit);
      if (*pcVar2 == '\\') {
        local_40 = std::__cxx11::string::find((string *)unit,(ulong)__end1);
        goto LAB_0019ac26;
      }
    }
    std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)unit,local_40);
    __range1._7_1_ = true;
    local_40 = std::__cxx11::string::find((string *)unit,(ulong)__end1);
  } while( true );
  __end1 = __end1 + 0x20;
  goto LAB_0019abfb;
}

Assistant:

static bool clearEmptySegments(std::string& unit)
{
    bool changed = false;
    for (const auto& seg : Esegs) {
        auto fnd = unit.find(seg);
        while (fnd != std::string::npos) {
            if (fnd > 0 && unit[fnd - 1] == '\\') {
                fnd = unit.find(seg, fnd + 2);
                continue;
            }
            unit.erase(fnd, seg.size());
            changed = true;
            fnd = unit.find(seg, fnd + 1);
        }
    }
    return changed;
}